

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::FloatImageTexture::ToString_abi_cxx11_(FloatImageTexture *this)

{
  string *in_RDI;
  MIPMap *in_stack_00000010;
  float *in_stack_00000018;
  TextureMapping2DHandle *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,float_const&,pbrt::MIPMap&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string FloatImageTexture::ToString() const {
    return StringPrintf("[ FloatImageTexture mapping: %s scale: %f mipmap: %s ]", mapping,
                        scale, *mipmap);
}